

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAgglomerateEl.cpp
# Opt level: O2

void __thiscall
TPZAgglomerateElement::CreateGraphicalElement
          (TPZAgglomerateElement *this,TPZGraphMesh *grmesh,int dimension)

{
  bool bVar1;
  int matid;
  int iVar2;
  TPZGeoEl *pTVar3;
  long *plVar4;
  TPZGraphElQ2dd *this_00;
  TPZGraphElQ3dd *this_01;
  TPZGraphEl1dd *this_02;
  TPZGraphElTd *this_03;
  
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar3 != (TPZGeoEl *)0x0) {
    plVar4 = (long *)(**(code **)(*(long *)&(this->super_TPZCompElDisc).super_TPZInterpolationSpace.
                                            super_TPZCompEl + 0xb8))(this);
    matid = (**(code **)(*plVar4 + 0x58))(plVar4);
    iVar2 = NSides(this);
    bVar1 = TPZGraphMesh::Material_Is_PostProcessed(grmesh,matid);
    if ((dimension == 2) && (bVar1)) {
      if (iVar2 == 7) {
        this_03 = (TPZGraphElTd *)operator_new(0x28);
        TPZGraphElTd::TPZGraphElTd(this_03,(TPZCompEl *)this,grmesh);
      }
      else if (iVar2 == 9) {
        this_00 = (TPZGraphElQ2dd *)operator_new(0x28);
        TPZGraphElQ2dd::TPZGraphElQ2dd(this_00,(TPZCompEl *)this,grmesh);
      }
    }
    else if (dimension != 3 || !bVar1) {
      if (dimension == 1 && bVar1) {
        this_02 = (TPZGraphEl1dd *)operator_new(0x28);
        TPZGraphEl1dd::TPZGraphEl1dd(this_02,(TPZCompEl *)this,grmesh);
      }
    }
    else {
      this_01 = (TPZGraphElQ3dd *)operator_new(0x28);
      TPZGraphElQ3dd::TPZGraphElQ3dd(this_01,(TPZCompEl *)this,grmesh);
    }
  }
  return;
}

Assistant:

void TPZAgglomerateElement::CreateGraphicalElement(TPZGraphMesh &grmesh, int dimension) {
	if(!Reference()) return;
	int matid = Material()->Id();
	int nsides = NSides();
    bool to_postpro = grmesh.Material_Is_PostProcessed(matid);
	if(dimension == 2 && to_postpro){
		if(nsides == 9){
			new TPZGraphElQ2dd(this,&grmesh);
			return;
		}
		if(nsides == 7){
			new TPZGraphElTd(this,&grmesh);
			return;
		}
	}
	if(dimension == 3 && to_postpro){
		new TPZGraphElQ3dd(this,&grmesh);
	}
	if(dimension == 1 && to_postpro){
		new TPZGraphEl1dd(this,&grmesh);
	}
}